

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountersReader.h
# Opt level: O2

void __thiscall
aeron::concurrent::CountersReader::validateCounterId(CountersReader *this,int32_t counterId)

{
  IllegalArgumentException *this_00;
  long lVar1;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((-1 < counterId) && (counterId <= this->m_maxCounterId)) {
    return;
  }
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_98,counterId);
  std::operator+(&local_78,"counter id ",&local_98);
  std::operator+(&local_58,&local_78," out of range: maxCounterId=");
  std::__cxx11::to_string(&local_b8,this->m_maxCounterId);
  std::operator+(&local_38,&local_58,&local_b8);
  std::__cxx11::string::string
            ((string *)&local_d8,
             "void aeron::concurrent::CountersReader::validateCounterId(std::int32_t) const",
             &local_f9);
  for (lVar1 = 0;
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
      [lVar1] ==
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/CountersReader.h"
      [lVar1]; lVar1 = lVar1 + 1) {
  }
  std::__cxx11::string::string
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/CountersReader.h"
             + (ulong)("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/CountersReader.h"
                       [lVar1] == '/') + lVar1,&local_fa);
  util::IllegalArgumentException::IllegalArgumentException
            (this_00,&local_38,&local_d8,&local_f8,0xdb);
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

void validateCounterId(std::int32_t counterId) const
    {
        if (counterId < 0 || counterId > m_maxCounterId)
        {
            throw util::IllegalArgumentException(
                "counter id " + std::to_string(counterId) +
                " out of range: maxCounterId=" + std::to_string(m_maxCounterId),
                SOURCEINFO);
        }
    }